

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::LeastFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  ScalarFunction local_138;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  GetLeastGreatestFunction<duckdb::LeastOp>();
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_138);
  local_138.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_138.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.function.super__Function_base._M_manager)
              ((_Any_data *)&local_138.function,(_Any_data *)&local_138.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_138.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LeastFun::GetFunctions() {
	return GetLeastGreatestFunctions<LeastOp>();
}